

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

int __thiscall Epanet::Project::writeReport(Project *this)

{
  FileError *this_00;
  string local_58;
  undefined1 local_38 [8];
  ReportWriter reportWriter;
  
  if (this->outputFileOpened != false) {
    ReportWriter::ReportWriter((ReportWriter *)local_38,&this->rptFile,&this->network);
    std::__cxx11::string::string((string *)&local_58,(string *)&this->inpFileName);
    ReportWriter::writeReport((ReportWriter *)local_38,&local_58,&this->outputFile);
    std::__cxx11::string::~string((string *)&local_58);
    ReportWriter::~ReportWriter((ReportWriter *)local_38);
    return 0;
  }
  this_00 = (FileError *)__cxa_allocate_exception(0x30);
  FileError::FileError(this_00,9);
  __cxa_throw(this_00,&FileError::typeinfo,ENerror::~ENerror);
}

Assistant:

int Project::writeReport()
    {
        try
        {
            if ( !outputFileOpened )
            {
                throw FileError(FileError::NO_RESULTS_SAVED_TO_REPORT);
            }
            ReportWriter reportWriter(rptFile, &network);
            reportWriter.writeReport(inpFileName, &outputFile);
            return 0;
        }
        catch (ENerror const& e)
        {
            writeMsg(e.msg);
            return e.code;
        }
    }